

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stop_time.c
# Opt level: O3

stop_type_t parse_stop_type(char *value)

{
  byte bVar1;
  
  bVar1 = *value;
  switch(bVar1) {
  case 0x30:
    if (value[1] == '\0') {
      return ST_REGULAR;
    }
    break;
  case 0x31:
    if (value[1] == '\0') {
      return ST_NOT_AVAILABLE;
    }
    break;
  case 0x32:
    return (uint)(value[1] != '\0') * 2 + ST_CONTACT_AGENCY;
  case 0x33:
    return ST_NOT_SET - (value[1] == '\0');
  default:
    if (bVar1 == 0) {
      return (uint)bVar1;
    }
  }
  return ST_NOT_SET;
}

Assistant:

stop_type_t parse_stop_type(const char *value) {
    if (strcmp(value, "0") == 0 || strcmp(value, "") == 0)
        return ST_REGULAR;
    else if (strcmp(value, "1") == 0)
        return ST_NOT_AVAILABLE;
    else if (strcmp(value, "2") == 0)
        return ST_CONTACT_AGENCY;
    else if (strcmp(value, "3") == 0)
        return ST_CONTACT_DRIVER;
    else
        return ST_NOT_SET;
}